

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O1

void zdscal(int n,double sa,complex<double> *cx,int incx)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  
  if (0 < incx && 0 < n) {
    if (incx != 1) {
      uVar2 = (ulong)(uint)n;
      pdVar3 = (double *)(cx->_M_value + 8);
      do {
        pdVar3[-1] = pdVar3[-1] * sa;
        *pdVar3 = *pdVar3 * sa;
        pdVar3 = pdVar3 + (ulong)(uint)incx * 2;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      return;
    }
    lVar1 = 0;
    do {
      *(double *)(cx->_M_value + lVar1) = *(double *)(cx->_M_value + lVar1) * sa;
      *(double *)(cx->_M_value + lVar1 + 8) = *(double *)(cx->_M_value + lVar1 + 8) * sa;
      lVar1 = lVar1 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar1);
  }
  return;
}

Assistant:

void zdscal ( int n, double sa, complex <double> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ZDSCAL scales a complex <double> vector by a double.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The scaling constant is double precision real.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double SA, the multiplier.
//
//    Input/output, complex <double> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of
//    the vector CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = sa * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = sa * cx[i*incx];
    }
  }
  return;
}